

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O0

void printdelem(rnndelem *elem,uint64_t offset)

{
  FILE *__stream;
  long lVar1;
  rnndelem *in_RSI;
  char *in_RDI;
  int j;
  int i;
  FILE *dst;
  int total;
  int len;
  int in_stack_ffffffffffffffd8;
  int iVar2;
  uint in_stack_ffffffffffffffdc;
  uint src;
  FILE *in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  if (*(int *)(in_RDI + 0x58) == 0) {
    if (*(long *)(in_RDI + 0x20) != 1) {
      if (stridesmax <= stridesnum) {
        if (stridesmax == 0) {
          stridesmax = 0x10;
        }
        else {
          stridesmax = stridesmax << 1;
        }
        strides = (uint64_t *)realloc(strides,(long)stridesmax << 3);
      }
      lVar1 = (long)stridesnum;
      stridesnum = stridesnum + 1;
      strides[lVar1] = *(uint64_t *)(in_RDI + 0x28);
    }
    if (*(long *)(in_RDI + 8) != 0) {
      if (stridesnum == 0) {
        printdef(_j,in_RDI,(int)((ulong)in_RSI >> 0x20),
                 CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                 (char *)in_stack_ffffffffffffffe0);
      }
      else {
        in_stack_ffffffffffffffe0 = (FILE *)findfout((char *)in_stack_ffffffffffffffe0);
        fprintf(in_stack_ffffffffffffffe0,"#define %s(%n",*(undefined8 *)(in_RDI + 0xf8),
                &stack0xffffffffffffffe8);
        for (src = 0; (int)src < stridesnum; src = src + 1) {
          if (src != 0) {
            fprintf(in_stack_ffffffffffffffe0,", ");
            in_stack_ffffffffffffffe8 = in_stack_ffffffffffffffe8 + 2;
          }
          fprintf(in_stack_ffffffffffffffe0,"i%d%n",(ulong)src,&stack0xffffffffffffffec);
          in_stack_ffffffffffffffe8 = in_stack_ffffffffffffffec + in_stack_ffffffffffffffe8;
        }
        fprintf(in_stack_ffffffffffffffe0,")");
        in_stack_ffffffffffffffe8 = in_stack_ffffffffffffffe8 + 1;
        seekcol((FILE *)in_stack_ffffffffffffffe0,src,in_stack_ffffffffffffffd8);
        fprintf(in_stack_ffffffffffffffe0,"(0x%08lx",(long)&in_RSI->type + *(long *)(in_RDI + 0x18))
        ;
        for (in_stack_ffffffffffffffdc = 0; (int)in_stack_ffffffffffffffdc < stridesnum;
            in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1) {
          fprintf(in_stack_ffffffffffffffe0," + %#lx*(i%d)",strides[(int)in_stack_ffffffffffffffdc],
                  (ulong)in_stack_ffffffffffffffdc);
        }
        fprintf(in_stack_ffffffffffffffe0,")\n");
      }
      if (*(long *)(in_RDI + 0x28) != 0) {
        printdef(_j,in_RDI,(int)((ulong)in_RSI >> 0x20),
                 CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                 (char *)in_stack_ffffffffffffffe0);
      }
      if (*(long *)(in_RDI + 0x20) != 1) {
        printdef(_j,in_RDI,(int)((ulong)in_RSI >> 0x20),
                 CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                 (char *)in_stack_ffffffffffffffe0);
      }
      printtypeinfo((rnntypeinfo *)in_RSI,
                    (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                    (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                    (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
    __stream = (FILE *)findfout((char *)in_stack_ffffffffffffffe0);
    fprintf(__stream,"\n");
    for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0x38); iVar2 = iVar2 + 1) {
      printdelem(in_RSI,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    }
    if (*(long *)(in_RDI + 0x20) != 1) {
      stridesnum = stridesnum + -1;
    }
  }
  return;
}

Assistant:

void printdelem (struct rnndelem *elem, uint64_t offset) {
	if (elem->varinfo.dead)
		return;
	if (elem->length != 1)
		ADDARRAY(strides, elem->stride);
	if (elem->name) {
		if (stridesnum) {
			int len, total;
			FILE *dst = findfout(elem->file);
			fprintf (dst, "#define %s(%n", elem->fullname, &total);
			int i;
			for (i = 0; i < stridesnum; i++) {
				if (i) {
					fprintf(dst, ", ");
					total += 2;
				}
				fprintf (dst, "i%d%n", i, &len);
				total += len;
			}
			fprintf (dst, ")");
			total++;
			seekcol (dst, total, startcol-1);
			fprintf (dst, "(0x%08"PRIx64"", offset + elem->offset);
			for (i = 0; i < stridesnum; i++)
				fprintf (dst, " + %#" PRIx64 "*(i%d)", strides[i], i);
			fprintf (dst, ")\n");
		} else
			printdef (elem->fullname, 0, 0, offset + elem->offset, elem->file);
		if (elem->stride)
			printdef (elem->fullname, "ESIZE", 0, elem->stride, elem->file);
		if (elem->length != 1)
			printdef (elem->fullname, "LEN", 0, elem->length, elem->file);
		printtypeinfo (&elem->typeinfo, elem->fullname, 0, elem->file);
	}
	fprintf (findfout(elem->file), "\n");
	int j;
	for (j = 0; j < elem->subelemsnum; j++) {
		printdelem(elem->subelems[j], offset + elem->offset);
	}
	if (elem->length != 1) stridesnum--;
}